

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2505:30),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2524:6)>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2505:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2524:6)>
          *this,ExceptionOrValue *output)

{
  WebSocket *pWVar1;
  undefined8 uVar2;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  anon_class_16_2_e7bfda6a_for_func local_328;
  ExceptionOr<kj::Promise<void>_> local_318;
  ExceptionOrValue local_1a0;
  char local_40;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_38;
  
  local_1a0.exception.ptr.isSet = false;
  local_40 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1a0);
  if (local_1a0.exception.ptr.isSet == true) {
    pWVar1 = (this->errorHandler).to;
    if (local_1a0.exception.ptr.field_1.value.type == DISCONNECTED) {
      (*pWVar1->_vptr_WebSocket[3])(&local_328);
    }
    else {
      if (local_1a0.exception.ptr.field_1.value.description.content.size_ == 0) {
        local_1a0.exception.ptr.field_1.value.description.content.ptr = "";
      }
      (*pWVar1->_vptr_WebSocket[2])
                (&local_328,pWVar1,0x3ea,
                 local_1a0.exception.ptr.field_1.value.description.content.ptr,
                 local_1a0.exception.ptr.field_1.value.description.content.size_ +
                 (local_1a0.exception.ptr.field_1.value.description.content.size_ == 0));
    }
    local_318.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_318.value.ptr.isSet = true;
    local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)local_328.from;
    local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)local_328.to;
    local_328.to = (WebSocket *)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_318)
    ;
    uVar2 = local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_318.value.ptr.isSet == true) &&
       (local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_318.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_318.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    pWVar1 = local_328.to;
    if ((PromiseNode *)local_328.to != (PromiseNode *)0x0) {
      local_328.to = (WebSocket *)0x0;
      (**(local_328.from)->_vptr_WebSocket)
                (local_328.from,
                 (_func_int *)((long)&pWVar1->_vptr_WebSocket + (long)pWVar1->_vptr_WebSocket[-2]));
    }
  }
  else if (local_40 == '\x01') {
    anon_class_16_2_e7bfda6a_for_func::operator()(&local_328,(Message *)&this->func);
    local_318.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_318.value.ptr.isSet = true;
    local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)local_328.from;
    local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)local_328.to;
    local_328.to = (WebSocket *)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_318)
    ;
    uVar2 = local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_318.value.ptr.isSet == true) &&
       (local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_318.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_318.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_318.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_318.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    pWVar1 = local_328.to;
    if ((PromiseNode *)local_328.to != (PromiseNode *)0x0) {
      local_328.to = (WebSocket *)0x0;
      (**(local_328.from)->_vptr_WebSocket)
                (local_328.from,
                 (_func_int *)((long)&pWVar1->_vptr_WebSocket + (long)pWVar1->_vptr_WebSocket[-2]));
    }
  }
  if (local_40 == '\x01') {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_38);
  }
  if (local_1a0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1a0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }